

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.cpp
# Opt level: O2

void sqlcheck::CheckNullUsage(Configuration *state,string *sql_statement,bool *print_statement)

{
  allocator local_a9;
  string title;
  regex pattern;
  string local_68;
  string local_48;
  
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
            (&pattern,"(null)",0x10);
  std::__cxx11::string::string((string *)&title,"NULL Usage",&local_a9);
  std::__cxx11::string::string((string *)&local_48,(string *)&title);
  std::__cxx11::string::string((string *)&local_68,anon_var_dwarf_a9860,&local_a9);
  CheckPattern(state,sql_statement,print_statement,&pattern,RISK_LEVEL_NONE,PATTERN_TYPE_QUERY,
               &local_48,&local_68,true,0);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&title);
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex(&pattern);
  return;
}

Assistant:

void CheckNullUsage(Configuration& state,
                    const std::string& sql_statement,
                    bool& print_statement) {

  std::regex pattern("(null)");
  std::string title = "NULL Usage";
  PatternType pattern_type = PatternType::PATTERN_TYPE_QUERY;

  auto message =
      "● Use NULL as a Unique Value:  "
      "NULL is not the same as zero. A number ten greater than an unknown is still an unknown. "
      "NULL is not the same as a string of zero length. "
      "Combining any string with NULL in standard SQL returns NULL. "
      "NULL is not the same as false. Boolean expressions with AND, OR, and NOT also produce "
      "results that some people find confusing. "
      "When you declare a column as NOT NULL, it should be because it would make no sense "
      "for the row to exist without a value in that column. "
      "Use null to signify a missing value for any data type.";

  CheckPattern(state,
               sql_statement,
               print_statement,
               pattern,
               RISK_LEVEL_NONE,
               pattern_type,
               title,
               message,
               true);

}